

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O3

bool ppmb_read_data(ifstream *input,int xsize,int ysize,uchar *r,uchar *g,uchar *b)

{
  undefined8 in_RAX;
  long lVar1;
  ostream *poVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char c;
  uchar local_49;
  int local_48;
  uint local_44;
  ulong local_40;
  long local_38;
  
  local_40 = 0;
  if (ysize < 1) {
    local_38 = 0;
  }
  else {
    lVar1 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_48 = xsize;
    local_44 = ysize;
    do {
      if (0 < local_48) {
        iVar4 = 0;
        local_38 = lVar1;
        do {
          std::istream::read((char *)input,(long)&local_49);
          if (r == (uchar *)0x0) {
            r = (uchar *)0x0;
          }
          else {
            *r = local_49;
            r = r + 1;
          }
          if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
            pcVar5 = "  End of file reading R byte of pixel (";
LAB_001055da:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"PPMB_READ_DATA - Fatal error!\n",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0x27);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_40);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,") \n",3);
            goto LAB_00105661;
          }
          std::istream::read((char *)input,(long)&local_49);
          if (g == (uchar *)0x0) {
            g = (uchar *)0x0;
          }
          else {
            *g = local_49;
            g = g + 1;
          }
          if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
            pcVar5 = "  End of file reading G byte of pixel (";
            goto LAB_001055da;
          }
          std::istream::read((char *)input,(long)&local_49);
          if (b == (uchar *)0x0) {
            b = (uchar *)0x0;
          }
          else {
            *b = local_49;
            b = b + 1;
          }
          lVar1 = *(long *)(*(long *)input + -0x18);
          if (((byte)input[lVar1 + 0x20] & 2) != 0) {
            pcVar5 = "  End of file reading B byte of pixel (";
            goto LAB_001055da;
          }
          iVar4 = iVar4 + 1;
        } while (local_48 != iVar4);
      }
      uVar3 = (int)local_40 + 1;
      local_40 = (ulong)uVar3;
      local_38 = CONCAT71((int7)((ulong)lVar1 >> 8),(int)uVar3 < (int)local_44);
      lVar1 = local_38;
    } while (uVar3 != local_44);
  }
LAB_00105661:
  return (bool)((byte)local_38 & 1);
}

Assistant:

bool ppmb_read_data ( ifstream &input, int xsize, int ysize, 
  unsigned char *r, unsigned char *g, unsigned char *b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_READ_DATA reads the data in a binary portable pixel map file.
//
//  Discussion:
//
//    If the ordinary ">>" operator is used to input the data, then data that
//    happens to look like new lines or other white space is skipped.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 December 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, ifstream &input, a pointer to the file containing the binary
//    portable pixel map data.
//
//    Input, int XSIZE, YSIZE, the number of rows and columns of data.
//
//    Input, unsigned char *R, *G, *B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_READ_DATA, is true if an error occurred.
//
{
  char c;
  bool error;
  int i;
  unsigned char *indexb;
  unsigned char *indexg;
  unsigned char *indexr;
  int j;
  int k;

  indexr = r;
  indexg = g;
  indexb = b;

  for ( j = 0; j < ysize; j++ )
  {
    for ( i = 0; i < xsize; i++ )
    {
      input.read ( &c, 1 );
	  if (indexr) {
        *indexr = ( unsigned char ) c;
         indexr = indexr + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading R byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexg) {
        *indexg = ( unsigned char ) c;
         indexg = indexg + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading G byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexb) {
        *indexb = ( unsigned char ) c;
        indexb = indexb + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading B byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

    }
  }
  return false;
}